

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

undefined8 randomfloats_abi_cxx11_(uint64_t howmany)

{
  bool bVar1;
  _Setprecision _Var2;
  ostream *poVar3;
  ulong in_RSI;
  undefined8 in_RDI;
  double d;
  uint64_t x;
  size_t i;
  uint64_t offset;
  stringstream out;
  double local_1c8;
  ulong local_1a8;
  long local_1a0;
  stringstream local_198 [16];
  ostream local_188 [376];
  ulong local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a0 = 0x4a6;
  for (local_1a8 = 1; local_1a8 <= local_10; local_1a8 = local_1a8 + 1) {
    local_1c8 = (double)rng(local_1a8 + local_1a0);
    while( true ) {
      bVar1 = std::isfinite(local_1c8);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_1a0 = local_1a0 + 1;
      local_1c8 = (double)rng(local_1a8 + local_1a0);
    }
    _Var2 = std::setprecision(0xf);
    poVar3 = std::operator<<(local_188,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c8);
    std::operator<<(poVar3," ");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string randomfloats(uint64_t howmany) {
  std::stringstream out;
  uint64_t offset = 1190;
  for (size_t i = 1; i <= howmany; i++) {
    uint64_t x = rng(i + offset);
    double d;
    ::memcpy(&d, &x, sizeof(double));
    // paranoid
    while (!std::isfinite(d)) {
      offset++;
      x = rng(i + offset);
      ::memcpy(&d, &x, sizeof(double));
    }
    out << std::setprecision(DBL_DIG) << d << " ";
  }
  return out.str();
}